

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex.h
# Opt level: O1

void __thiscall
Gudhi::cubical_complex::
Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
initialize_filtration
          (Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
           *this)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  end;
  unsigned_long uVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var2;
  is_before_in_filtration<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_> local_10;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->sorted_cells,
             (long)(this->super_Bitmap_cubical_complex_base<double>).data.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->super_Bitmap_cubical_complex_base<double>).data.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  begin._M_current =
       (this->sorted_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  end._M_current =
       (this->sorted_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (begin._M_current != end._M_current) {
    uVar1 = 0;
    _Var2._M_current = begin._M_current;
    do {
      *_Var2._M_current = uVar1;
      uVar1 = uVar1 + 1;
      _Var2._M_current = _Var2._M_current + 1;
    } while (_Var2._M_current != end._M_current);
  }
  local_10.CC_ = this;
  tbb::detail::d1::
  parallel_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,Gudhi::cubical_complex::is_before_in_filtration<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>>>
            (begin,end,&local_10);
  return;
}

Assistant:

void Bitmap_cubical_complex<T>::initialize_filtration() {
#ifdef DEBUG_TRACES
  std::clog << "void Bitmap_cubical_complex<T>::initialize_elements_ordered_according_to_filtration() \n";
#endif
  this->sorted_cells.resize(this->data.size());
  std::iota(std::begin(sorted_cells), std::end(sorted_cells), 0);
#ifdef GUDHI_USE_TBB
  tbb::parallel_sort(sorted_cells.begin(), sorted_cells.end(),
                     is_before_in_filtration<T>(this));
#else
  std::sort(sorted_cells.begin(), sorted_cells.end(), is_before_in_filtration<T>(this));
#endif
}